

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O3

void emitter_json_object_end(emitter_t *emitter)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  if (emitter_output_json_compact < emitter->output) {
    return;
  }
  emitter->nesting_depth = emitter->nesting_depth + -1;
  emitter->item_at_depth = true;
  if (emitter->output != emitter_output_json_compact) {
    emitter_printf(emitter,anon_var_dwarf_63f1717 + 8);
    pcVar3 = anon_var_dwarf_63f1aec + 7;
    if (emitter->output != emitter_output_json) {
      pcVar3 = " ";
    }
    if (0 < emitter->nesting_depth) {
      iVar1 = emitter->nesting_depth << (emitter->output != emitter_output_json);
      iVar2 = 1;
      if (1 < iVar1) {
        iVar2 = iVar1;
      }
      do {
        emitter_printf(emitter,"%s",pcVar3);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
  }
  emitter_printf(emitter,"}");
  return;
}

Assistant:

static inline void
emitter_json_object_end(emitter_t *emitter) {
	if (emitter_outputs_json(emitter)) {
		assert(emitter->nesting_depth > 0);
		emitter_nest_dec(emitter);
		if (emitter->output != emitter_output_json_compact) {
			emitter_printf(emitter, "\n");
			emitter_indent(emitter);
		}
		emitter_printf(emitter, "}");
	}
}